

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility.cpp
# Opt level: O0

void SetCompatibilityParams(void)

{
  int iVar1;
  DWORD DVar2;
  side_t *this;
  sector_t *psVar3;
  line_t *plVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  uint *puVar8;
  DWORD *pDVar9;
  FMapThing *pFVar10;
  bool bVar11;
  side_t *side;
  sector_t *sec;
  line_t *line_4;
  line_t *line_3;
  int ii;
  line_t *line_2;
  line_t *line_1;
  line_t *line;
  uint i;
  
  if (ii_compatparams != -1) {
    line._4_4_ = ii_compatparams;
    while( true ) {
      uVar5 = TArray<int,_int>::Size(&CompatParams);
      bVar11 = false;
      if (line._4_4_ < uVar5) {
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)line._4_4_);
        bVar11 = *piVar7 != 0;
      }
      if (!bVar11) break;
      piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)line._4_4_);
      switch(*piVar7) {
      case 1:
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar4 = lines;
        if (*piVar7 < numlines) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar1 = *piVar7;
          puVar8 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar4[iVar1].flags = (*puVar8 ^ 0xffffffff) & plVar4[iVar1].flags;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 2:
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar4 = lines;
        if (*piVar7 < numlines) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar1 = *piVar7;
          puVar8 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar4[iVar1].flags = *puVar8 | plVar4[iVar1].flags;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 3:
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar4 = lines;
        if (*piVar7 < numlines) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar1 = *piVar7;
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar4[iVar1].special = *piVar7;
          for (line_3._4_4_ = 0; line_3._4_4_ < 5; line_3._4_4_ = line_3._4_4_ + 1) {
            piVar7 = TArray<int,_int>::operator[]
                               (&CompatParams,(ulong)(line._4_4_ + line_3._4_4_ + 3));
            plVar4[iVar1].args[line_3._4_4_] = *piVar7;
          }
        }
        line._4_4_ = line._4_4_ + 8;
        break;
      case 4:
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar4 = lines;
        if (*piVar7 < numlines) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar1 = *piVar7;
          plVar4[iVar1].special = 0;
          memset(plVar4[iVar1].args,0,0x14);
        }
        line._4_4_ = line._4_4_ + 2;
        break;
      case 5:
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar4 = lines;
        if (*piVar7 < numlines) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar1 = *piVar7;
          pDVar9 = (DWORD *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar4[iVar1].activation = *pDVar9;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 6:
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        psVar3 = sectors;
        if (*piVar7 < numsectors) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar1 = *piVar7;
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          secplane_t::ChangeHeight(&psVar3[iVar1].floorplane,(double)*piVar7);
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          sector_t::ChangePlaneTexZ(psVar3 + iVar1,0,(double)*piVar7 / 65536.0);
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 7:
        piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar4 = lines;
        if (*piVar7 < numlines) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar1 = *piVar7;
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          this = plVar4[iVar1].sidedef[*piVar7];
          if (this != (side_t *)0x0) {
            piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 3));
            iVar1 = *piVar7;
            piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 4));
            side_t::SetTextureYScale(this,iVar1,(double)*piVar7 / 65536.0);
          }
        }
        line._4_4_ = line._4_4_ + 5;
        break;
      case 8:
        puVar8 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        uVar5 = *puVar8;
        uVar6 = TArray<FMapThing,_FMapThing>::Size(&MapThingsConverted);
        if (uVar5 < uVar6) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          iVar1 = *piVar7;
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          pFVar10 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(long)*piVar7);
          (pFVar10->pos).Z = (double)iVar1 / 256.0;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 9:
        puVar8 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        if (*puVar8 < (uint)numsectors) {
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          if (*piVar7 == 0) {
            piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
            FTagManager::RemoveSectorTags(&tagManager,*piVar7);
          }
          else {
            piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
            iVar1 = *piVar7;
            piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
            FTagManager::AddSectorTag(&tagManager,iVar1,*piVar7);
          }
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 10:
        puVar8 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        uVar5 = *puVar8;
        uVar6 = TArray<FMapThing,_FMapThing>::Size(&MapThingsConverted);
        if (uVar5 < uVar6) {
          pDVar9 = (DWORD *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          DVar2 = *pDVar9;
          piVar7 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          pFVar10 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(long)*piVar7);
          pFVar10->flags = DVar2;
        }
        line._4_4_ = line._4_4_ + 3;
      }
    }
  }
  return;
}

Assistant:

void SetCompatibilityParams()
{
	if (ii_compatparams != -1)
	{
		unsigned i = ii_compatparams;

		while (i < CompatParams.Size() && CompatParams[i] != CP_END)
		{
			switch (CompatParams[i])
			{
				case CP_CLEARFLAGS:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->flags &= ~CompatParams[i+2];
					}
					i+=3;
					break;
				}
				case CP_SETFLAGS:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->flags |= CompatParams[i+2];
					}
					i+=3;
					break;
				}
				case CP_SETSPECIAL:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->special = CompatParams[i+2];
						for(int ii=0;ii<5;ii++)
						{
							line->args[ii] = CompatParams[i+ii+3];
						}
					}
					i+=8;
					break;
				}
				case CP_CLEARSPECIAL:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->special = 0;
						memset(line->args, 0, sizeof(line->args));
					}
					i += 2;
					break;
				}
				case CP_SETACTIVATION:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->activation = CompatParams[i+2];
					}
					i += 3;
					break;
				}
				case CP_SECTORFLOOROFFSET:
				{
					if (CompatParams[i+1] < numsectors)
					{
						sector_t *sec = &sectors[CompatParams[i+1]];
						sec->floorplane.ChangeHeight(CompatParams[i+2]);
						sec->ChangePlaneTexZ(sector_t::floor, CompatParams[i+2] / 65536.);
					}
					i += 3;
					break;
				}
				case CP_SETWALLYSCALE:
				{
					if (CompatParams[i+1] < numlines)
					{
						side_t *side = lines[CompatParams[i+1]].sidedef[CompatParams[i+2]];
						if (side != NULL)
						{
							side->SetTextureYScale(CompatParams[i+3], CompatParams[i+4] / 65536.);
						}
					}
					i += 5;
					break;
				}
				case CP_SETTHINGZ:
				{
					// When this is called, the things haven't been spawned yet so we can alter the position inside the MapThings array.
					if ((unsigned)CompatParams[i+1] < MapThingsConverted.Size())
					{
						MapThingsConverted[CompatParams[i+1]].pos.Z = CompatParams[i+2]/256.;
					}
					i += 3;
					break;
				}	
				case CP_SETTAG:
				{
					if ((unsigned)CompatParams[i + 1] < (unsigned)numsectors)
					{
						// this assumes that the sector does not have any tags yet!
						if (CompatParams[i + 2] == 0)
						{
							tagManager.RemoveSectorTags(CompatParams[i + 1]);
						}
						else
						{
							tagManager.AddSectorTag(CompatParams[i + 1], CompatParams[i + 2]);
						}
					}
					i += 3;
					break;
				}
				case CP_SETTHINGFLAGS:
				{
					if ((unsigned)CompatParams[i + 1] < MapThingsConverted.Size())
					{
						MapThingsConverted[CompatParams[i + 1]].flags = CompatParams[i + 2];
					}
					i += 3;
					break;
				}
			}
		}
	}
}